

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

char  [7] __thiscall
kj::
str<kj::_::DebugComparison<std::__detail::_Node_iterator<kj::StringPtr,true,true>&,std::__detail::_Node_iterator<kj::StringPtr,true,true>>&>
          (kj *this,
          DebugComparison<std::__detail::_Node_iterator<kj::StringPtr,_true,_true>_&,_std::__detail::_Node_iterator<kj::StringPtr,_true,_true>_>
          *params)

{
  DebugComparison<std::__detail::_Node_iterator<kj::StringPtr,_true,_true>_&,_std::__detail::_Node_iterator<kj::StringPtr,_true,_true>_>
  *value;
  String local_30;
  DebugComparison<std::__detail::_Node_iterator<kj::StringPtr,_true,_true>_&,_std::__detail::_Node_iterator<kj::StringPtr,_true,_true>_>
  *local_18;
  DebugComparison<std::__detail::_Node_iterator<kj::StringPtr,_true,_true>_&,_std::__detail::_Node_iterator<kj::StringPtr,_true,_true>_>
  *params_local;
  
  local_18 = params;
  params_local = (DebugComparison<std::__detail::_Node_iterator<kj::StringPtr,_true,_true>_&,_std::__detail::_Node_iterator<kj::StringPtr,_true,_true>_>
                  *)this;
  value = fwd<kj::_::DebugComparison<std::__detail::_Node_iterator<kj::StringPtr,true,true>&,std::__detail::_Node_iterator<kj::StringPtr,true,true>>&>
                    (params);
  toCharSequence<kj::_::DebugComparison<std::__detail::_Node_iterator<kj::StringPtr,true,true>&,std::__detail::_Node_iterator<kj::StringPtr,true,true>>&>
            ((kj *)&local_30,value);
  _::concat((String *)this,&local_30);
  String::~String(&local_30);
  return SUB87(this,0);
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}